

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_List.h
# Opt level: O2

Iterator __thiscall
axl::sl::
ListBase<RwLockThread,_axl::sl::ImplicitPtrCast<RwLockThread,_axl::sl::ListLink>,_axl::sl::Iterator<RwLockThread,_axl::sl::ImplicitPtrCast<RwLockThread,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<RwLockThread,_axl::sl::ImplicitPtrCast<RwLockThread,_axl::sl::ListLink>_>_>
::insertTail(ListBase<RwLockThread,_axl::sl::ImplicitPtrCast<RwLockThread,_axl::sl::ListLink>,_axl::sl::Iterator<RwLockThread,_axl::sl::ImplicitPtrCast<RwLockThread,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<RwLockThread,_axl::sl::ImplicitPtrCast<RwLockThread,_axl::sl::ListLink>_>_>
             *this,RwLockThread *p)

{
  size_t *psVar1;
  RwLockThread *pRVar2;
  ListLink *link;
  
  pRVar2 = (this->super_ListData<RwLockThread>).m_tail;
  (p->super_ListLink).m_next = (ListLink *)0x0;
  (p->super_ListLink).m_prev = &pRVar2->super_ListLink;
  if (pRVar2 == (RwLockThread *)0x0) {
    pRVar2 = (RwLockThread *)this;
  }
  (pRVar2->super_ListLink).m_next = &p->super_ListLink;
  (this->super_ListData<RwLockThread>).m_tail = p;
  psVar1 = &(this->super_ListData<RwLockThread>).m_count;
  *psVar1 = *psVar1 + 1;
  return (IteratorImpl<axl::sl::Iterator<RwLockThread,_axl::sl::ImplicitPtrCast<RwLockThread,_axl::sl::ListLink>_>,_RwLockThread,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<RwLockThread,_axl::sl::ListLink>_>
          )(IteratorImpl<axl::sl::Iterator<RwLockThread,_axl::sl::ImplicitPtrCast<RwLockThread,_axl::sl::ListLink>_>,_RwLockThread,_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<RwLockThread,_axl::sl::ListLink>_>
            )p;
}

Assistant:

Iterator
	insertTail(T* p) {
		ListLink* link = GetLink()(p);
		ListLink* tailLink = Iterator::getLinkFromEntry(this->m_tail);

		link->m_next = NULL;
		link->m_prev = tailLink;

		if (tailLink)
			tailLink->m_next = link;
		else
			this->m_head = p;

		this->m_tail = p;
		this->m_count++;

		return p;
	}